

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbolize.cc
# Opt level: O0

void google::SafeAppendHexNumber(uint64_t value,char *dest,size_t dest_size)

{
  char *source;
  char local_38 [8];
  char buf [17];
  size_t dest_size_local;
  char *dest_local;
  uint64_t value_local;
  
  unique0x10000063 = dest_size;
  memset(local_38,0,0x11);
  source = itoa_r(value,local_38,0x11,0x10,0);
  SafeAppendString(source,dest,stack0xffffffffffffffe0);
  return;
}

Assistant:

static void SafeAppendHexNumber(uint64_t value, char* dest, size_t dest_size) {
  // 64-bit numbers in hex can have up to 16 digits.
  char buf[17] = {'\0'};
  SafeAppendString(itoa_r(value, buf, sizeof(buf), 16, 0), dest, dest_size);
}